

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginTooltipEx(ImGuiTooltipFlags tooltip_flags,ImGuiWindowFlags extra_window_flags)

{
  short sVar1;
  ImGuiWindow *window_00;
  uint in_EDI;
  ImGuiWindowFlags flags;
  ImGuiWindow *window;
  char window_name [16];
  ImVec2 tooltip_pos;
  ImGuiContext *g;
  ImGuiWindowFlags in_stack_000003fc;
  bool *in_stack_00000400;
  char *in_stack_00000408;
  ImVec2 *in_stack_ffffffffffffffa8;
  ImVec2 *in_stack_ffffffffffffffb0;
  char local_38 [16];
  ImVec2 local_28;
  ImVec2 local_20;
  ImVec2 local_18;
  ImGuiContext *local_10;
  uint local_4;
  
  local_10 = GImGui;
  local_4 = in_EDI;
  if (((GImGui->DragDropWithinSource & 1U) != 0) || ((GImGui->DragDropWithinTarget & 1U) != 0)) {
    in_stack_ffffffffffffffb0 = &(GImGui->IO).MousePos;
    local_20 = ::operator*(in_stack_ffffffffffffffa8,0.0);
    local_18 = ::operator+(in_stack_ffffffffffffffa8,(ImVec2 *)0x1fd985);
    ImVec2::ImVec2(&local_28,0.0,0.0);
    SetNextWindowPos(&local_18,0,&local_28);
    SetNextWindowBgAlpha((local_10->Style).Colors[4].w * 0.6);
    local_4 = local_4 | 2;
  }
  ImFormatString(local_38,0x10,"##Tooltip_%02d",(ulong)(uint)(int)local_10->TooltipOverrideCount);
  if ((((local_4 & 2) != 0) &&
      (window_00 = FindWindowByName((char *)in_stack_ffffffffffffffb0),
      window_00 != (ImGuiWindow *)0x0)) && ((window_00->Active & 1U) != 0)) {
    SetWindowHiddenAndSkipItemsForCurrentFrame(window_00);
    sVar1 = local_10->TooltipOverrideCount + 1;
    local_10->TooltipOverrideCount = sVar1;
    ImFormatString(local_38,0x10,"##Tooltip_%02d",(ulong)(uint)(int)sVar1);
  }
  Begin(in_stack_00000408,in_stack_00000400,in_stack_000003fc);
  return true;
}

Assistant:

bool ImGui::BeginTooltipEx(ImGuiTooltipFlags tooltip_flags, ImGuiWindowFlags extra_window_flags)
{
    ImGuiContext& g = *GImGui;

    if (g.DragDropWithinSource || g.DragDropWithinTarget)
    {
        // Drag and Drop tooltips are positioning differently than other tooltips:
        // - offset visibility to increase visibility around mouse.
        // - never clamp within outer viewport boundary.
        // We call SetNextWindowPos() to enforce position and disable clamping.
        // See FindBestWindowPosForPopup() for positionning logic of other tooltips (not drag and drop ones).
        //ImVec2 tooltip_pos = g.IO.MousePos - g.ActiveIdClickOffset - g.Style.WindowPadding;
        ImVec2 tooltip_pos = g.IO.MousePos + TOOLTIP_DEFAULT_OFFSET * g.Style.MouseCursorScale;
        SetNextWindowPos(tooltip_pos);
        SetNextWindowBgAlpha(g.Style.Colors[ImGuiCol_PopupBg].w * 0.60f);
        //PushStyleVar(ImGuiStyleVar_Alpha, g.Style.Alpha * 0.60f); // This would be nice but e.g ColorButton with checkboard has issue with transparent colors :(
        tooltip_flags |= ImGuiTooltipFlags_OverridePrevious;
    }

    char window_name[16];
    ImFormatString(window_name, IM_ARRAYSIZE(window_name), "##Tooltip_%02d", g.TooltipOverrideCount);
    if (tooltip_flags & ImGuiTooltipFlags_OverridePrevious)
        if (ImGuiWindow* window = FindWindowByName(window_name))
            if (window->Active)
            {
                // Hide previous tooltip from being displayed. We can't easily "reset" the content of a window so we create a new one.
                SetWindowHiddenAndSkipItemsForCurrentFrame(window);
                ImFormatString(window_name, IM_ARRAYSIZE(window_name), "##Tooltip_%02d", ++g.TooltipOverrideCount);
            }
    ImGuiWindowFlags flags = ImGuiWindowFlags_Tooltip | ImGuiWindowFlags_NoInputs | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoMove | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_AlwaysAutoResize;
    Begin(window_name, NULL, flags | extra_window_flags);
    // 2023-03-09: Added bool return value to the API, but currently always returning true.
    // If this ever returns false we need to update BeginDragDropSource() accordingly.
    //if (!ret)
    //    End();
    //return ret;
    return true;
}